

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool jsonip::parser::
     apply_until_<jsonip::parser::or_<jsonip::parser::new_line,jsonip::parser::notchar_<(char)10>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>,jsonip::grammar::ccomment_end>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  Reader *pRVar2;
  bool bVar3;
  PositionType p_2;
  PositionType p_1;
  pointer pSVar4;
  char *pcVar5;
  PositionType p;
  char *pcVar6;
  iterator iVar7;
  undefined1 auStack_30 [8];
  State cur_state;
  
  auStack_30 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  iVar7._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,iVar7,(State *)auStack_30);
    iVar7._M_current =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar7._M_current)->pos_ = (PositionType)auStack_30;
    (iVar7._M_current)->line_ = (size_t)cur_state.pos_;
    iVar7._M_current =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (state->stack_).
    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
  }
  auStack_30 = (undefined1  [8])state->reader_->pos_;
  while( true ) {
    cur_state.pos_ = (PositionType)state->line_;
    if (iVar7._M_current ==
        (state->stack_).
        super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
      ::
      _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
                ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                  *)&state->stack_,iVar7,(State *)auStack_30);
    }
    else {
      (iVar7._M_current)->pos_ = (PositionType)auStack_30;
      (iVar7._M_current)->line_ = (size_t)cur_state.pos_;
      ppSVar1 = &(state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    pRVar2 = state->reader_;
    pcVar5 = pRVar2->pos_;
    pcVar6 = pcVar5;
    if (((long)pcVar5 - (long)pRVar2->buf_ != pRVar2->len_) && (*pcVar5 == '*')) {
      pcVar6 = pcVar5 + 1;
      pRVar2->pos_ = pcVar6;
      if (((long)pcVar6 - (long)pRVar2->buf_ != pRVar2->len_) && (*pcVar6 == '/')) {
        pcVar5 = pcVar5 + 2;
        pRVar2->pos_ = pcVar5;
        if (state->max_pos_ < pcVar5) {
          state->max_pos_ = pcVar5;
        }
        pSVar4 = (state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        bVar3 = true;
        goto LAB_001153f5;
      }
    }
    if (state->max_pos_ < pcVar6) {
      state->max_pos_ = pcVar6;
    }
    auStack_30 = (undefined1  [8])
                 (state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
    pRVar2->pos_ = (PositionType)auStack_30;
    pSVar4 = (state->stack_).
             super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    cur_state.pos_ = (PositionType)pSVar4[-1].line_;
    state->line_ = (size_t)cur_state.pos_;
    iVar7._M_current = pSVar4 + -1;
    (state->stack_).
    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
    if (iVar7._M_current ==
        (state->stack_).
        super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
      ::
      _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
                ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                  *)&state->stack_,iVar7,(State *)auStack_30);
    }
    else {
      (iVar7._M_current)->pos_ = (PositionType)auStack_30;
      pSVar4[-1].line_ = (size_t)cur_state.pos_;
      ppSVar1 = &(state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    pRVar2 = state->reader_;
    pcVar6 = pRVar2->pos_;
    if ((long)pcVar6 - (long)pRVar2->buf_ == pRVar2->len_) break;
    if (*pcVar6 == '\n') {
      state->line_ = state->line_ + 1;
    }
    auStack_30 = (undefined1  [8])(pcVar6 + 1);
    pRVar2->pos_ = (PositionType)auStack_30;
    if (state->max_pos_ < (ulong)auStack_30) {
      state->max_pos_ = (PositionType)auStack_30;
    }
    iVar7._M_current =
         (state->stack_).
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    (state->stack_).
    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
  }
  pcVar5 = state->max_pos_;
  if (state->max_pos_ < pcVar6) {
    state->max_pos_ = pcVar6;
    pcVar5 = pcVar6;
  }
  pcVar6 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
  pRVar2->pos_ = pcVar6;
  pSVar4 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar4 + -1;
  if (pcVar5 < pcVar6) {
    state->max_pos_ = pcVar6;
  }
  pRVar2->pos_ = pSVar4[-2].pos_;
  pSVar4 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  state->line_ = pSVar4[-1].line_;
  bVar3 = false;
LAB_001153f5:
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar4 + -1;
  return bVar3;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = false;

            while (!(var = C1::match(state)))
                if (!C0::match(state)) break;

            var ? state.commit() : state.rollback();

            return var;
        }